

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m3x3.cpp
# Opt level: O1

int M3x3_BuildVMarkerRotationMatrix(double *p0,double *p1,double *p2,double (*m) [3])

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  
  dVar4 = *p1 - *p0;
  dVar1 = p1[1] - p0[1];
  dVar5 = p1[2] - p0[2];
  dVar2 = dVar5 * dVar5 + dVar4 * dVar4 + dVar1 * dVar1;
  if (dVar2 < 0.0) {
    dVar2 = sqrt(dVar2);
  }
  else {
    dVar2 = SQRT(dVar2);
  }
  if ((dVar2 != 0.0) || (NAN(dVar2))) {
    dVar7 = *p2 - *p0;
    dVar9 = p2[1] - p0[1];
    dVar8 = p2[2] - p0[2];
    dVar3 = dVar8 * dVar8 + dVar7 * dVar7 + dVar9 * dVar9;
    if (dVar3 < 0.0) {
      dVar3 = sqrt(dVar3);
    }
    else {
      dVar3 = SQRT(dVar3);
    }
    if ((dVar3 != 0.0) || (NAN(dVar3))) {
      dVar4 = dVar4 / dVar2;
      dVar1 = dVar1 / dVar2;
      dVar5 = dVar5 / dVar2;
      dVar6 = dVar1 * (dVar8 / dVar3) - (dVar9 / dVar3) * dVar5;
      dVar8 = dVar5 * (dVar7 / dVar3) - (dVar8 / dVar3) * dVar4;
      dVar3 = dVar4 * (dVar9 / dVar3) - (dVar7 / dVar3) * dVar1;
      dVar2 = dVar3 * dVar3 + dVar6 * dVar6 + dVar8 * dVar8;
      if (dVar2 < 0.0) {
        dVar2 = sqrt(dVar2);
      }
      else {
        dVar2 = SQRT(dVar2);
      }
      if ((dVar2 != 0.0) || (NAN(dVar2))) {
        dVar6 = dVar6 / dVar2;
        dVar8 = dVar8 / dVar2;
        dVar3 = dVar3 / dVar2;
        dVar7 = dVar8 * dVar5 - dVar1 * dVar3;
        dVar9 = dVar3 * dVar4 - dVar5 * dVar6;
        dVar10 = dVar6 * dVar1 - dVar4 * dVar8;
        dVar2 = dVar10 * dVar10 + dVar7 * dVar7 + dVar9 * dVar9;
        if (dVar2 < 0.0) {
          dVar2 = sqrt(dVar2);
        }
        else {
          dVar2 = SQRT(dVar2);
        }
        (*m)[0] = dVar4;
        m[1][0] = dVar1;
        m[2][0] = dVar5;
        (*m)[1] = dVar7 / dVar2;
        m[1][1] = dVar9 / dVar2;
        m[2][1] = dVar10 / dVar2;
        (*m)[2] = dVar6;
        m[1][2] = dVar8;
        m[2][2] = dVar3;
        return 0;
      }
    }
  }
  (*m)[0] = 9999999.0;
  return -1;
}

Assistant:

int M3x3_BuildVMarkerRotationMatrix(
    double p0[3], // origin marker
    double p1[3], // long axis marker
    double p2[3], // plane marker
    double m[3][3])
{
    double dist;
    double dx, dy, dz;
    double v1[3];
    double v2[3];
    double v3[3];

 // Here's some basic vector algebra. Figure it out.

 // First unit vector

    dx = p1[0] - p0[0];
    dy = p1[1] - p0[1];
    dz = p1[2] - p0[2];

    dist = sqrt(dx*dx + dy*dy + dz*dz);
    if (dist == 0)
    {
        m[0][0] = XEMPTY;
        return ERRFLAG;
    }

    v1[0] = dx / dist;
    v1[1] = dy / dist;
    v1[2] = dz / dist;


 // Second unit vector

    dx = p2[0] - p0[0];
    dy = p2[1] - p0[1];
    dz = p2[2] - p0[2];

    dist = sqrt(dx*dx + dy*dy + dz*dz);
    if (dist == 0)
    {
        m[0][0] = XEMPTY;
        return ERRFLAG;
    }

    v2[0] = dx / dist;
    v2[1] = dy / dist;
    v2[2] = dz / dist;


 // Cross product v3 = Normalized (v1 X v2) give perpendicular vector

    dx = v1[1]*v2[2] - v1[2]*v2[1];
    dy = v1[2]*v2[0] - v1[0]*v2[2];
    dz = v1[0]*v2[1] - v1[1]*v2[0];

    dist = sqrt(dx*dx + dy*dy + dz*dz);
    if (dist == 0)
    {
        m[0][0] = XEMPTY;
        return ERRFLAG;
    }

    v3[0] = dx / dist;
    v3[1] = dy / dist;
    v3[2] = dz / dist;


 // Note: v2 is the only vector not completed as perpendicular
 // Cross product v2 = Normalized (v3 X v1) makes the final perpendicular vector

    dx = v3[1]*v1[2] - v3[2]*v1[1];
    dy = v3[2]*v1[0] - v3[0]*v1[2];
    dz = v3[0]*v1[1] - v3[1]*v1[0];

    dist = sqrt(dx*dx + dy*dy + dz*dz);

    v2[0] = dx / dist;
    v2[1] = dy / dist;
    v2[2] = dz / dist;


 // OK, now fill in the matrix

    m[0][0] = v1[0];
    m[1][0] = v1[1];
    m[2][0] = v1[2];

    m[0][1] = v2[0];
    m[1][1] = v2[1];
    m[2][1] = v2[2];

    m[0][2] = v3[0];
    m[1][2] = v3[1];
    m[2][2] = v3[2];

    return OK;
}